

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zCrc.c
# Opt level: O2

UInt32 CrcUpdateT1(UInt32 v,void *data,size_t size,UInt32 *table)

{
  Byte *p;
  size_t sVar1;
  
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    v = v >> 8 ^ table[(byte)(*(byte *)((long)data + sVar1) ^ (byte)v)];
  }
  return v;
}

Assistant:

UInt32 MY_FAST_CALL CrcUpdateT1(UInt32 v, const void *data, size_t size, const UInt32 *table)
{
  const Byte *p = (const Byte *)data;
  const Byte *pEnd = p + size;
  for (; p != pEnd; p++)
    v = CRC_UPDATE_BYTE_2(v, *p);
  return v;
}